

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

Interaction * __thiscall phyr::Sphere::sample(Sphere *this,Point2f *u,double *pdf)

{
  double *in_RCX;
  long *in_RSI;
  Interaction *in_RDI;
  double dVar1;
  double extraout_XMM0_Qa;
  double dVar2;
  Vector3f pObjError;
  Point3f pObj;
  Vector3<double> *in_stack_fffffffffffffe88;
  Transform *in_stack_fffffffffffffe90;
  Point3<double> *in_stack_fffffffffffffe98;
  Interaction *n;
  double local_138;
  Point2f *in_stack_fffffffffffffed0;
  double local_128;
  Vector3<double> local_120 [3];
  Point3<double> local_d8;
  Normal3<double> local_c0 [2];
  double local_90;
  double local_88;
  double local_80;
  Vector3<double> *in_stack_ffffffffffffffc8;
  Vector3<double> *in_stack_ffffffffffffffd0;
  Point3<double> *in_stack_ffffffffffffffd8;
  Transform *in_stack_ffffffffffffffe0;
  
  n = in_RDI;
  Point3<double>::Point3((Point3<double> *)&stack0xffffffffffffffb8,0.0,0.0,0.0);
  uniformSampleSphere(in_stack_fffffffffffffed0);
  operator*((double)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Point3<double>::operator+((Point3<double> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  Interaction::Interaction((Interaction *)in_stack_fffffffffffffe90);
  Normal3<double>::Normal3
            (local_c0,(double)in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffd8,
             (double)in_stack_ffffffffffffffe0);
  Transform::operator()(in_stack_fffffffffffffe90,(Normal3<double> *)in_stack_fffffffffffffe88);
  normalize<double>((Normal3<double> *)n);
  (in_RDI->n).x = local_90;
  (in_RDI->n).y = local_88;
  (in_RDI->n).z = local_80;
  if ((*(byte *)(in_RSI + 3) & 1) != 0) {
    Normal3<double>::operator*=(&in_RDI->n,-1);
  }
  dVar2 = (double)in_RSI[4];
  Point3<double>::Point3(&local_d8,0.0,0.0,0.0);
  dVar1 = distance<double>(&n->p,in_stack_fffffffffffffe98);
  Point3<double>::operator*=((Point3<double> *)&stack0xffffffffffffffd0,dVar2 / dVar1);
  gamma(extraout_XMM0_Qa);
  Vector3<double>::Vector3(local_120,(Point3<double> *)&stack0xffffffffffffffd0);
  abs<double>((Vector3<double> *)n);
  operator*(dVar2,in_stack_fffffffffffffe88);
  Transform::operator()
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffc8);
  (in_RDI->p).x = local_138;
  (in_RDI->p).y = (double)in_stack_fffffffffffffed0;
  (in_RDI->p).z = local_128;
  dVar2 = (double)(**(code **)(*in_RSI + 0x20))();
  *in_RCX = 1.0 / dVar2;
  return n;
}

Assistant:

Interaction Sphere::sample(const Point2f& u, Real* pdf) const {
    Point3f pObj = Point3f(0, 0, 0) + radius * uniformSampleSphere(u);
    Interaction it;

    it.n = normalize((*localToWorld)(Normal3f(pObj.x, pObj.y, pObj.z)));
    if (reverseNormals) it.n *= -1;

    // Reproject _pObj_ to sphere surface and compute _pObjError_
    pObj *= radius / distance(pObj, Point3f(0, 0, 0));
    Vector3f pObjError = gamma(5) * abs((Vector3f)pObj);
    it.p = (*localToWorld)(pObj, pObjError, &it.pfError);
    *pdf = 1 / surfaceArea();

    return it;
}